

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_htmlify(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  vm_obj_id_t obj;
  wchar_t wVar4;
  CVmObject *this;
  char *str_00;
  int *in_RCX;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  int this_is_sp_1;
  wchar_t ch;
  int this_is_sp;
  uint argc;
  int prv_was_sp;
  vm_obj_id_t result_obj;
  long flags;
  size_t extra;
  size_t rem;
  utf8_ptr dstp;
  utf8_ptr p;
  size_t bytelen;
  undefined4 in_stack_ffffffffffffff68;
  wchar_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  wchar_t in_stack_ffffffffffffff78;
  int iVar5;
  undefined4 in_stack_ffffffffffffff80;
  int iVar6;
  undefined4 in_stack_ffffffffffffff84;
  int local_60;
  utf8_ptr local_40;
  utf8_ptr local_38;
  size_t local_30;
  int *local_28;
  char *local_20;
  vm_val_t *local_18;
  vm_val_t *local_10;
  
  local_28 = in_RCX;
  local_20 = (char *)in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  utf8_ptr::utf8_ptr(&local_38);
  utf8_ptr::utf8_ptr(&local_40);
  if (local_28 == (int *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *local_28;
  }
  iVar5 = iVar6;
  if ((getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_htmlify::desc,0,1);
    __cxa_guard_release(&getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(iVar5,in_stack_ffffffffffffff78),
                     (uint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (iVar2 == 0) {
    if (iVar6 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = CVmBif::pop_long_val();
    }
    CVmStack::push(local_18);
    local_30 = vmb_get_len((char *)0x33a6b7);
    local_20 = (char *)((long)local_20 + 2);
    utf8_ptr::set(&local_38,local_20);
    sVar1 = local_30;
    while (sVar1 != 0) {
      in_stack_ffffffffffffff78 = utf8_ptr::getch((utf8_ptr *)0x33a712);
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (size_t *)CONCAT44(iVar5,in_stack_ffffffffffffff78));
    }
    obj = create(in_stack_ffffffffffffff74,
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    this = vm_objp(0);
    str_00 = cons_get_buf((CVmObjString *)this);
    utf8_ptr::set(&local_40,str_00);
    local_60 = 0;
    utf8_ptr::set(&local_38,local_20);
    sVar1 = local_30;
    while (sVar1 != 0) {
      wVar4 = utf8_ptr::getch((utf8_ptr *)0x33a8a8);
      iVar6 = 0;
      if (wVar4 == L'\t') {
        iVar6 = 1;
        if ((uVar3 & 4) == 0) {
LAB_0033a9e5:
          utf8_ptr::setch((utf8_ptr *)CONCAT44(wVar4,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
        }
        else {
          utf8_ptr::setch_str((utf8_ptr *)CONCAT44(9,in_stack_ffffffffffffff70),
                              (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
          ;
        }
      }
      else if (wVar4 == L'\n') {
LAB_0033a9b7:
        iVar6 = 1;
        if ((uVar3 & 2) == 0) goto LAB_0033a9e5;
        utf8_ptr::setch_str((utf8_ptr *)CONCAT44(wVar4,in_stack_ffffffffffffff70),
                            (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else if (wVar4 == L' ') {
        iVar6 = 1;
        if ((local_60 == 0) || ((uVar3 & 1) == 0)) goto LAB_0033a9e5;
        utf8_ptr::setch_str((utf8_ptr *)CONCAT44(0x20,in_stack_ffffffffffffff70),
                            (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else if (wVar4 == L'&') {
        utf8_ptr::setch_str((utf8_ptr *)CONCAT44(0x26,in_stack_ffffffffffffff70),
                            (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else if (wVar4 == L'<') {
        utf8_ptr::setch_str((utf8_ptr *)CONCAT44(0x3c,in_stack_ffffffffffffff70),
                            (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else {
        if (wVar4 != L'>') {
          if (wVar4 == L'\x2028') goto LAB_0033a9b7;
          goto LAB_0033a9e5;
        }
        utf8_ptr::setch_str((utf8_ptr *)CONCAT44(0x3e,in_stack_ffffffffffffff70),
                            (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      utf8_ptr::inc((utf8_ptr *)CONCAT44(wVar4,iVar6),
                    (size_t *)CONCAT44(iVar5,in_stack_ffffffffffffff78));
      local_60 = iVar6;
    }
    vm_val_t::set_obj(local_10,obj);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjString::getp_htmlify(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *str, uint *in_argc)
{
    size_t bytelen;
    utf8_ptr p;
    utf8_ptr dstp;
    size_t rem;
    size_t extra;
    long flags;
    vm_obj_id_t result_obj;
    int prv_was_sp;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* if they specified flags, pop them */
    if (argc >= 1)
    {
        /* retrieve the flags */
        flags = CVmBif::pop_long_val(vmg0_);
    }
    else
    {
        /* no flags */
        flags = 0;
    }

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* 
     *   scan the string to determine how much space we'll have to add to
     *   generate the htmlified version 
     */
    for (prv_was_sp = FALSE, extra = 0, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        int this_is_sp;

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(p.getch())
        {
        case '&':
            /* we must replace '&' with '&amp;' - this adds four bytes */
            extra += 4;
            break;
            
        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            extra += 3;
            break;

        case '>':
            /* replace '>' with '&gt;' */
            extra += 3;
            break;

        case ' ':
            /* 
             *   If we're in preserve-spaces mode, and the previous space
             *   was some kind of whitespace character, change this to
             *   '&nbsp;' - this adds five bytes 
             */
            if (prv_was_sp && (flags & VMSTR_HTMLIFY_KEEP_SPACES) != 0)
                extra += 5;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\t':
            /* if we're in preserve-tabs mode, change this to '<tab>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) != 0)
                extra += 4;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\n':
        case 0x2028:
            /* if we're in preserve-newlines mode, change this to '<br>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) != 0)
                extra += 3;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* allocate space for the new string */
    result_obj = create(vmg_ FALSE, bytelen + extra);

    /* get a pointer to the result buffer */
    dstp.set(((CVmObjString *)vm_objp(vmg_ result_obj))->cons_get_buf());

    /* translate the string and write the result */
    for (prv_was_sp = FALSE, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;
        int this_is_sp;

        /* get this character */
        ch = p.getch();

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(ch)
        {
        case '&':
            /* replace '&' with '&amp;' */
            dstp.setch_str("&amp;");
            break;

        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            dstp.setch_str("&lt;");
            break;

        case '>':
            dstp.setch_str("&gt;");
            break;

        case ' ':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* 
             *   ignore it if not in preserve-spaces mode, or if the
             *   previous character wasn't whitespace of some kind 
             */
            if (!prv_was_sp || (flags & VMSTR_HTMLIFY_KEEP_SPACES) == 0)
                goto do_default;

            /* add the nbsp */
            dstp.setch_str("&nbsp;");
            break;

        case '\t':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* ignore if not in preserve-tabs mode */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) == 0)
                goto do_default;

            /* add the <tab> */
            dstp.setch_str("<tab>");
            break;

        case '\n':
        case 0x2028:
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* if we're not in preserve-newlines mode, ignore it */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) == 0)
                goto do_default;

            /* add the <br> */
            dstp.setch_str("<br>");
            break;

        default:
        do_default:
            /* copy this character unchanged */
            dstp.setch(ch);
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* return the new string */
    retval->set_obj(result_obj);
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}